

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CPrimitiveMode::Run<glcts::(anonymous_namespace)::test_api::GL>
          (CPrimitiveMode *this,bool pointMode)

{
  CallLogWrapper *this_00;
  GLuint GVar1;
  runtime_error *this_01;
  uint uVar2;
  bool compute;
  uint uVar3;
  size_t i;
  long lVar4;
  undefined7 in_register_00000031;
  allocator_type local_c29;
  CColorArray coords;
  CColorArray padding;
  CColorArray bufferTest3;
  CElementArray elements;
  CColorArray bufferTest;
  DrawArraysIndirectCommand indirectArrays;
  CColorArray bufferTest5;
  CColorArray bufferTest4;
  CColorArray bufferRef5;
  uint local_b38 [6];
  CColorArray bufferRef3;
  CColorArray bufferRef4;
  CColorArray bufferRef2;
  CColorArray bufferRef1;
  Vector<float,_4> local_ab8;
  DIResult result;
  DILogger local_920;
  DILogger local_7a0;
  DILogger local_620;
  DILogger local_4a0;
  DILogger local_320;
  DILogger local_1a0;
  
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glClear(this_00,0x4000);
  if ((int)CONCAT71(in_register_00000031,pointMode) == 0) {
    anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  }
  else {
    glcts::(anonymous_namespace)::test_api::GL::glslVer_abi_cxx11_
              ((string *)&result,(GL *)0x0,compute);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&coords,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   "\nin vec4 i_vertex;\nvoid main()\n{\n    gl_Position = i_vertex;\n#if defined(GL_ES)\n    gl_PointSize = 1.0;\n#endif\n}"
                  );
    std::__cxx11::string::~string((string *)&result);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,fixed_sample_locations_values + 1,(allocator<char> *)&elements);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar1 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)&coords,(string *)&result,
                     (string *)&padding,true);
  this->_program = GVar1;
  std::__cxx11::string::~string((string *)&padding);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&coords);
  if (this->_program == 0) {
    result.status_ = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    DrawIndirectBase::PrimitiveGen
              (&this->super_DrawIndirectBase,this->_primitiveType,this->_drawSizeX,this->_drawSizeY,
               &coords);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&result,0.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&padding,10,(value_type *)&result,(allocator_type *)&elements);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)padding.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish +
               ((long)(coords.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->m_data -
               ((long)(padding.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data +
               (long)(coords.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data)) & 0xfffffffffffffff0,
               (void *)0x0,0x88e0);
    glu::CallLogWrapper::glBufferSubData
              (this_00,0x8892,0,
               (long)padding.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)padding.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               padding.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBufferSubData
              (this_00,0x8892,
               (long)padding.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)padding.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               coords.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    local_b38[0] = 0;
    local_b38[1] = 0;
    local_b38[2] = 0;
    local_b38[3] = 0;
    local_b38[4] = 0;
    indirectArrays.count = 0;
    indirectArrays.primCount = 0;
    indirectArrays.first = 0;
    indirectArrays.reservedMustBeZero = 0;
    result.logger_._0_8_ = (ulong)(uint)result.logger_._4_4_ << 0x20;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&elements,
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type_conflict4 *)&result,
               (allocator_type *)&bufferRef1);
    for (lVar4 = 0;
        (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != lVar4; lVar4 = lVar4 + 1) {
      elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] = (uint)lVar4;
    }
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    if (this->_drawFunc == DRAW_ARRAYS) {
      indirectArrays.count =
           (uint)((ulong)((long)coords.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)coords.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5) & 0x7fffffff;
      indirectArrays.primCount = 1;
      indirectArrays.first = 10;
      indirectArrays.reservedMustBeZero = 0;
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x10,(void *)0x0,0x88e4);
      glu::CallLogWrapper::glBufferSubData(this_00,0x8f3f,0,0x10,&indirectArrays);
      glu::CallLogWrapper::glDrawArraysIndirect(this_00,this->_primitiveType,(void *)0x0);
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Unknown draw function!");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_b38[0] = (uint)((ulong)((long)coords.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)coords.
                                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) &
                     0x7fffffff;
      local_b38[1] = 1;
      local_b38[2] = 3;
      local_b38[3] = 7;
      local_b38[4] = 0;
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,(void *)0x0,0x88e4);
      glu::CallLogWrapper::glBufferSubData(this_00,0x8f3f,0,0x14,local_b38);
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8893,
                 (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                 elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88e4);
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,this->_primitiveType,0x1405,(void *)0x0);
    }
    result.logger_.null_log_ = false;
    result.logger_._1_7_ = 0;
    result.logger_.str_.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&bufferRef1,(ulong)(this->_sizeY * this->_sizeX >> 1),(value_type *)&result,
               (allocator_type *)&bufferRef2);
    result.logger_.null_log_ = true;
    result.logger_._1_7_ = 0x3e4ccccd3dcccc;
    result.logger_.str_.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x3f8000003e99999a;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&bufferRef2,(ulong)(this->_sizeY * this->_sizeX >> 1),(value_type *)&result,
               (allocator_type *)&bufferTest);
    uVar2 = this->_sizeY;
    uVar3 = this->_sizeX;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&result,0.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&bufferTest,(ulong)(uVar2 * uVar3),(value_type *)&result,
               (allocator_type *)&bufferRef3);
    DIResult::DIResult(&result);
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
              (&this->super_DrawIndirectBase,0,this->_sizeY + 1 >> 1,this->_sizeX,this->_sizeY >> 1,
               bufferTest.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    uVar2 = this->_sizeY >> 1;
    lVar4 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&bufferTest,this->_sizeX,uVar2,&bufferRef1,
                       this->_sizeX,uVar2);
    DIResult::sub_result(&local_1a0,&result,lVar4);
    DILogger::~DILogger(&local_1a0);
    if ((this->_primitiveType & 0xfffffffe) == 0xc) {
      bufferRef4.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bufferRef4.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&bufferRef3,(ulong)(this->_sizeY * this->_sizeX >> 4),(value_type *)&bufferRef4,
                 (allocator_type *)&bufferRef5);
      bufferRef5.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
      bufferRef5.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f8000003e99999a;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&bufferRef4,(ulong)(this->_sizeY * this->_sizeX >> 3),(value_type *)&bufferRef5,
                 (allocator_type *)&bufferTest3);
      bufferTest3.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bufferTest3.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&bufferRef5,(ulong)(this->_sizeY * this->_sizeX >> 2),(value_type *)&bufferTest3,
                 (allocator_type *)&bufferTest4);
      uVar2 = this->_sizeY;
      uVar3 = this->_sizeX;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&bufferTest4,0.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&bufferTest3,(ulong)(uVar2 * uVar3 >> 4),(value_type *)&bufferTest4,
                 (allocator_type *)&bufferTest5);
      uVar2 = this->_sizeY;
      uVar3 = this->_sizeX;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&bufferTest5,0.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&bufferTest4,(ulong)(uVar2 * uVar3 >> 3),(value_type *)&bufferTest5,
                 (allocator_type *)&local_ab8);
      uVar2 = this->_sizeY;
      uVar3 = this->_sizeX;
      tcu::Vector<float,_4>::Vector(&local_ab8,0.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&bufferTest5,(ulong)(uVar2 * uVar3 >> 2),&local_ab8,&local_c29);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
                (&this->super_DrawIndirectBase,0,this->_sizeY + 3 >> 2,this->_sizeX >> 2,
                 this->_sizeY >> 2,
                 bufferTest3.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      uVar3 = this->_sizeX >> 2;
      uVar2 = this->_sizeY >> 2;
      lVar4 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&bufferTest3,uVar3,uVar2,&bufferRef3,uVar3,uVar2);
      DIResult::sub_result(&local_320,&result,lVar4);
      DILogger::~DILogger(&local_320);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
                (&this->super_DrawIndirectBase,this->_sizeX + 3 >> 2,this->_sizeY + 3 >> 2,
                 this->_sizeX >> 1,this->_sizeY >> 2,
                 bufferTest4.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      uVar3 = this->_sizeX >> 1;
      uVar2 = this->_sizeY >> 2;
      lVar4 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&bufferTest4,uVar3,uVar2,&bufferRef4,uVar3,uVar2);
      DIResult::sub_result(&local_4a0,&result,lVar4);
      DILogger::~DILogger(&local_4a0);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
                (&this->super_DrawIndirectBase,this->_sizeX * 3 + 3 >> 2,this->_sizeY + 3 >> 2,
                 this->_sizeX >> 2,this->_sizeY >> 2,
                 bufferTest3.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      uVar3 = this->_sizeX >> 2;
      uVar2 = this->_sizeY >> 2;
      lVar4 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&bufferTest3,uVar3,uVar2,&bufferRef3,uVar3,uVar2);
      DIResult::sub_result(&local_620,&result,lVar4);
      DILogger::~DILogger(&local_620);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
                (&this->super_DrawIndirectBase,0,0,this->_sizeX,this->_sizeY >> 2,
                 bufferTest5.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      uVar2 = this->_sizeY >> 2;
      lVar4 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&bufferTest5,this->_sizeX,uVar2,&bufferRef5,
                         this->_sizeX,uVar2);
      DIResult::sub_result(&local_7a0,&result,lVar4);
      DILogger::~DILogger(&local_7a0);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&bufferTest5.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&bufferTest4.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&bufferTest3.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&bufferRef5.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&bufferRef4.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&bufferRef3.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
    }
    else {
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
                (&this->super_DrawIndirectBase,0,0,this->_sizeX,this->_sizeY >> 1,
                 bufferTest.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      uVar2 = this->_sizeY >> 1;
      lVar4 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&bufferTest,this->_sizeX,uVar2,&bufferRef2,
                         this->_sizeX,uVar2);
      DIResult::sub_result(&local_920,&result,lVar4);
      DILogger::~DILogger(&local_920);
    }
    DILogger::~DILogger(&result.logger_);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&bufferTest.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&bufferRef2.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&bufferRef1.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&padding.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&coords.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  }
  return result.status_;
}

Assistant:

long Run(bool pointMode = false)
	{

		glClear(GL_COLOR_BUFFER_BIT);

		_program = CreateProgram(pointMode ? shaders::vshSimple_point<api>() : shaders::vshSimple<api>(), "",
								 shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(_primitiveType, _drawSizeX, _drawSizeY, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		CColorArray padding(10, tcu::Vec4(0.0f));

		glBufferData(GL_ARRAY_BUFFER,
					 (GLsizeiptr)(coords.size() * (sizeof(coords[0])) + padding.size() * (sizeof(padding[0]))), NULL,
					 GL_STREAM_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, (GLsizeiptr)(padding.size() * (sizeof(padding[0]))), &padding[0]);
		glBufferSubData(GL_ARRAY_BUFFER, (GLintptr)(padding.size() * (sizeof(padding[0]))),
						(GLsizeiptr)(coords.size() * (sizeof(coords[0]))), &coords[0]);

		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		DrawArraysIndirectCommand   indirectArrays   = { 0, 0, 0, 0 };

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			indirectArrays.count			  = static_cast<GLuint>(coords.size()) / 2;
			indirectArrays.primCount		  = 1;
			indirectArrays.first			  = 10;
			indirectArrays.reservedMustBeZero = 0;

			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), NULL, GL_STATIC_DRAW);
			glBufferSubData(GL_DRAW_INDIRECT_BUFFER, 0, sizeof(DrawArraysIndirectCommand), &indirectArrays);

			glDrawArraysIndirect(_primitiveType, 0);
		}
		break;
		case DRAW_ELEMENTS:
		{
			indirectElements.count				= static_cast<GLuint>(coords.size()) / 2;
			indirectElements.primCount			= 1;
			indirectElements.baseVertex			= 7;
			indirectElements.firstIndex			= 3;
			indirectElements.reservedMustBeZero = 0;

			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), NULL, GL_STATIC_DRAW);
			glBufferSubData(GL_DRAW_INDIRECT_BUFFER, 0, sizeof(DrawElementsIndirectCommand), &indirectElements);

			glGenBuffers(1, &_ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
						 GL_STATIC_DRAW);

			glDrawElementsIndirect(_primitiveType, GL_UNSIGNED_INT, 0);
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef1(_sizeX * _sizeY / 2, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		CColorArray bufferRef2(_sizeX * _sizeY / 2, tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(_sizeX * _sizeY, tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, (_sizeY + 1) / 2, _sizeX, _sizeY / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, _sizeX, _sizeY / 2, bufferRef1, _sizeX, _sizeY / 2));

		switch (_primitiveType)
		{
		case GL_TRIANGLES_ADJACENCY:
		case GL_TRIANGLE_STRIP_ADJACENCY:
		{
			CColorArray bufferRef3(_sizeX * _sizeY / 16, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
			CColorArray bufferRef4(_sizeX * _sizeY / 8, tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
			CColorArray bufferRef5(_sizeX * _sizeY / 4, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));

			CColorArray bufferTest3(_sizeX * _sizeY / 16, tcu::Vec4(0.0f));
			CColorArray bufferTest4(_sizeX * _sizeY / 8, tcu::Vec4(0.0f));
			CColorArray bufferTest5(_sizeX * _sizeY / 4, tcu::Vec4(0.0f));

			ReadPixelsFloat<api>(0, (_sizeY + 3) / 4, _sizeX / 4, _sizeY / 4, &bufferTest3[0]);
			result.sub_result(BuffersCompare(bufferTest3, _sizeX / 4, _sizeY / 4, bufferRef3, _sizeX / 4, _sizeY / 4));

			ReadPixelsFloat<api>((_sizeX + 3) / 4, (_sizeY + 3) / 4, _sizeX / 2, _sizeY / 4, &bufferTest4[0]);
			result.sub_result(BuffersCompare(bufferTest4, _sizeX / 2, _sizeY / 4, bufferRef4, _sizeX / 2, _sizeY / 4));

			ReadPixelsFloat<api>((_sizeX * 3 + 3) / 4, (_sizeY + 3) / 4, _sizeX / 4, _sizeY / 4, &bufferTest3[0]);
			result.sub_result(BuffersCompare(bufferTest3, _sizeX / 4, _sizeY / 4, bufferRef3, _sizeX / 4, _sizeY / 4));

			ReadPixelsFloat<api>(0, 0, _sizeX, _sizeY / 4, &bufferTest5[0]);
			result.sub_result(BuffersCompare(bufferTest5, _sizeX, _sizeY / 4, bufferRef5, _sizeX, _sizeY / 4));
		}
		break;
		default:
		{
			ReadPixelsFloat<api>(0, 0, _sizeX, _sizeY / 2, &bufferTest[0]);
			result.sub_result(BuffersCompare(bufferTest, _sizeX, _sizeY / 2, bufferRef2, _sizeX, _sizeY / 2));
		}
		break;
		}

		return result.code();
	}